

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O0

void __thiscall DependanceEstimator::collect(DependanceEstimator *this)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar2;
  int m;
  int n;
  double source;
  double base;
  DependanceEstimator *this_local;
  
  if (((this->super_Estimator).nEstimate & 0x40U) == 0) {
    (*(((this->super_Estimator).pSource)->super_Parametric)._vptr_Parametric[8])();
    _m = extraout_XMM0_Qa_00;
  }
  else {
    (*(((this->super_Estimator).pSource)->super_Parametric)._vptr_Parametric[7])();
    _m = extraout_XMM0_Qa;
  }
  if (((this->super_Estimator).nEstimate & 0x80U) == 0) {
    (*(this->xBase->super_Parametric)._vptr_Parametric[8])();
    source = extraout_XMM0_Qa_02;
  }
  else {
    (*(this->xBase->super_Parametric)._vptr_Parametric[7])();
    source = extraout_XMM0_Qa_01;
  }
  dVar2 = floor((source - this->dBegin) / this->getIncrement);
  iVar1 = (int)dVar2;
  if ((-1 < iVar1) && (iVar1 < this->dependanceBins)) {
    (this->super_Estimator).nSamples = (this->super_Estimator).nSamples + 1;
    this->aSamples[iVar1] = this->aSamples[iVar1] + 1.0;
    if (((this->super_Estimator).nEstimate & 4U) != 0) {
      this->aOne[iVar1] = _m + this->aOne[iVar1];
    }
    if (((this->super_Estimator).nEstimate & 8U) != 0) {
      this->aTwo[iVar1] = _m * _m + this->aTwo[iVar1];
    }
    if (((this->super_Estimator).nEstimate & 0x10U) != 0) {
      this->aThree[iVar1] = _m * _m * _m + this->aThree[iVar1];
    }
    if (((((this->super_Estimator).nEstimate & 2U) != 0) && (this->dDistBegin <= _m)) &&
       (_m < this->dDistDelta || _m == this->dDistDelta)) {
      dVar2 = floor((_m - this->dDistBegin) / this->dDistDelta);
      this->aDist[iVar1][(int)dVar2] = this->aDist[iVar1][(int)dVar2] + 1.0;
    }
  }
  return;
}

Assistant:

void DependanceEstimator::collect()
{
	// find appropriate bin
	double base, source;
	if (nEstimate & EST_DIFF)
		source = pSource->getIncrement();
	 else
		source = pSource->getCurrentValue();
	if (nEstimate & EST_BASE_DIFF)
		base = xBase->getIncrement();
	else
		base = xBase->getCurrentValue();
	int n = int(floor((base - dBegin) / getIncrement));
	
	// check if base value is in bounds
	if (n<0 || n>=dependanceBins)
		return;
		
	// record sample
	++nSamples;
	++aSamples[n];
	if (nEstimate & EST_MEAN)
		aOne[n] += source;
	if (nEstimate & EST_VAR)
		aTwo[n] += source*source;
	if (nEstimate & EST_CUR)
		aThree[n] += source*source*source;
	if (nEstimate & EST_DENS) {
		if (source < dDistBegin || source > dDistDelta)
			return;
		int m = int (floor((source - dDistBegin) / dDistDelta));
		++aDist[n][m];
	}
}